

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

lzma_ret lzma_code(lzma_stream *strm,lzma_action action)

{
  lzma_ret local_34;
  size_t sStack_30;
  lzma_ret ret;
  size_t out_pos;
  size_t in_pos;
  lzma_stream *plStack_18;
  lzma_action action_local;
  lzma_stream *strm_local;
  
  if ((((strm->next_in != (uint8_t *)0x0) || (strm->avail_in == 0)) &&
      ((strm->next_out != (uint8_t *)0x0 || (strm->avail_out == 0)))) &&
     ((((strm->internal != (lzma_internal *)0x0 &&
        ((strm->internal->next).code != (lzma_code_function)0x0)) &&
       (action < (LZMA_FULL_BARRIER|LZMA_SYNC_FLUSH))) &&
      ((strm->internal->supported_actions[action] & 1U) != 0)))) {
    if (((strm->reserved_ptr1 == (void *)0x0) && (strm->reserved_ptr2 == (void *)0x0)) &&
       ((((strm->reserved_ptr3 == (void *)0x0 &&
          ((strm->reserved_ptr4 == (void *)0x0 && (strm->reserved_int1 == 0)))) &&
         (strm->reserved_int2 == 0)) &&
        ((((strm->reserved_int3 == 0 && (strm->reserved_int4 == 0)) &&
          (strm->reserved_enum1 == LZMA_RESERVED_ENUM)) &&
         (strm->reserved_enum2 == LZMA_RESERVED_ENUM)))))) {
      switch(strm->internal->sequence) {
      case ISEQ_RUN:
        switch(action) {
        case LZMA_RUN:
          break;
        case LZMA_SYNC_FLUSH:
          strm->internal->sequence = ISEQ_SYNC_FLUSH;
          break;
        case LZMA_FULL_FLUSH:
          strm->internal->sequence = ISEQ_FULL_FLUSH;
          break;
        case LZMA_FINISH:
          strm->internal->sequence = ISEQ_FINISH;
          break;
        case LZMA_FULL_BARRIER:
          strm->internal->sequence = ISEQ_FULL_BARRIER;
        }
        break;
      case ISEQ_SYNC_FLUSH:
        if ((action != LZMA_SYNC_FLUSH) || (strm->internal->avail_in != strm->avail_in)) {
          return LZMA_PROG_ERROR;
        }
        break;
      case ISEQ_FULL_FLUSH:
        if ((action != LZMA_FULL_FLUSH) || (strm->internal->avail_in != strm->avail_in)) {
          return LZMA_PROG_ERROR;
        }
        break;
      case ISEQ_FINISH:
        if ((action != LZMA_FINISH) || (strm->internal->avail_in != strm->avail_in)) {
          return LZMA_PROG_ERROR;
        }
        break;
      case ISEQ_FULL_BARRIER:
        if ((action != LZMA_FULL_BARRIER) || (strm->internal->avail_in != strm->avail_in)) {
          return LZMA_PROG_ERROR;
        }
        break;
      case ISEQ_END:
        return LZMA_STREAM_END;
      case ISEQ_ERROR:
      default:
        return LZMA_PROG_ERROR;
      }
      out_pos = 0;
      sStack_30 = 0;
      in_pos._4_4_ = action;
      plStack_18 = strm;
      local_34 = (*(strm->internal->next).code)
                           ((strm->internal->next).coder,strm->allocator,strm->next_in,&out_pos,
                            strm->avail_in,strm->next_out,&stack0xffffffffffffffd0,strm->avail_out,
                            action);
      plStack_18->next_in = plStack_18->next_in + out_pos;
      plStack_18->avail_in = plStack_18->avail_in - out_pos;
      plStack_18->total_in = plStack_18->total_in + out_pos;
      plStack_18->next_out = plStack_18->next_out + sStack_30;
      plStack_18->avail_out = plStack_18->avail_out - sStack_30;
      plStack_18->total_out = plStack_18->total_out + sStack_30;
      plStack_18->internal->avail_in = plStack_18->avail_in;
      switch(local_34) {
      case LZMA_OK:
        if ((sStack_30 == 0) && (out_pos == 0)) {
          if ((plStack_18->internal->allow_buf_error & 1U) == 0) {
            plStack_18->internal->allow_buf_error = true;
          }
          else {
            local_34 = LZMA_BUF_ERROR;
          }
        }
        else {
          plStack_18->internal->allow_buf_error = false;
        }
        break;
      case LZMA_STREAM_END:
        if (((plStack_18->internal->sequence == ISEQ_SYNC_FLUSH) ||
            (plStack_18->internal->sequence == ISEQ_FULL_FLUSH)) ||
           (plStack_18->internal->sequence == ISEQ_FULL_BARRIER)) {
          plStack_18->internal->sequence = ISEQ_RUN;
        }
        else {
          plStack_18->internal->sequence = ISEQ_END;
        }
      case LZMA_NO_CHECK:
      case LZMA_UNSUPPORTED_CHECK:
      case LZMA_GET_CHECK:
      case LZMA_MEMLIMIT_ERROR:
        plStack_18->internal->allow_buf_error = false;
        break;
      default:
        if (local_34 == LZMA_BUF_ERROR) {
          __assert_fail("ret != LZMA_BUF_ERROR",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/common.c"
                        ,0x15b,"lzma_ret lzma_code(lzma_stream *, lzma_action)");
        }
        plStack_18->internal->sequence = ISEQ_ERROR;
        break;
      case 0x20:
        plStack_18->internal->allow_buf_error = false;
        local_34 = LZMA_OK;
      }
      return local_34;
    }
    return LZMA_OPTIONS_ERROR;
  }
  return LZMA_PROG_ERROR;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_code(lzma_stream *strm, lzma_action action)
{
	// Sanity checks
	if ((strm->next_in == NULL && strm->avail_in != 0)
			|| (strm->next_out == NULL && strm->avail_out != 0)
			|| strm->internal == NULL
			|| strm->internal->next.code == NULL
			|| (unsigned int)(action) > LZMA_ACTION_MAX
			|| !strm->internal->supported_actions[action])
		return LZMA_PROG_ERROR;

	// Check if unsupported members have been set to non-zero or non-NULL,
	// which would indicate that some new feature is wanted.
	if (strm->reserved_ptr1 != NULL
			|| strm->reserved_ptr2 != NULL
			|| strm->reserved_ptr3 != NULL
			|| strm->reserved_ptr4 != NULL
			|| strm->reserved_int1 != 0
			|| strm->reserved_int2 != 0
			|| strm->reserved_int3 != 0
			|| strm->reserved_int4 != 0
			|| strm->reserved_enum1 != LZMA_RESERVED_ENUM
			|| strm->reserved_enum2 != LZMA_RESERVED_ENUM)
		return LZMA_OPTIONS_ERROR;

	switch (strm->internal->sequence) {
	case ISEQ_RUN:
		switch (action) {
		case LZMA_RUN:
			break;

		case LZMA_SYNC_FLUSH:
			strm->internal->sequence = ISEQ_SYNC_FLUSH;
			break;

		case LZMA_FULL_FLUSH:
			strm->internal->sequence = ISEQ_FULL_FLUSH;
			break;

		case LZMA_FINISH:
			strm->internal->sequence = ISEQ_FINISH;
			break;

		case LZMA_FULL_BARRIER:
			strm->internal->sequence = ISEQ_FULL_BARRIER;
			break;
		}

		break;

	case ISEQ_SYNC_FLUSH:
		// The same action must be used until we return
		// LZMA_STREAM_END, and the amount of input must not change.
		if (action != LZMA_SYNC_FLUSH
				|| strm->internal->avail_in != strm->avail_in)
			return LZMA_PROG_ERROR;

		break;

	case ISEQ_FULL_FLUSH:
		if (action != LZMA_FULL_FLUSH
				|| strm->internal->avail_in != strm->avail_in)
			return LZMA_PROG_ERROR;

		break;

	case ISEQ_FINISH:
		if (action != LZMA_FINISH
				|| strm->internal->avail_in != strm->avail_in)
			return LZMA_PROG_ERROR;

		break;

	case ISEQ_FULL_BARRIER:
		if (action != LZMA_FULL_BARRIER
				|| strm->internal->avail_in != strm->avail_in)
			return LZMA_PROG_ERROR;

		break;

	case ISEQ_END:
		return LZMA_STREAM_END;

	case ISEQ_ERROR:
	default:
		return LZMA_PROG_ERROR;
	}

	size_t in_pos = 0;
	size_t out_pos = 0;
	lzma_ret ret = strm->internal->next.code(
			strm->internal->next.coder, strm->allocator,
			strm->next_in, &in_pos, strm->avail_in,
			strm->next_out, &out_pos, strm->avail_out, action);

	strm->next_in += in_pos;
	strm->avail_in -= in_pos;
	strm->total_in += in_pos;

	strm->next_out += out_pos;
	strm->avail_out -= out_pos;
	strm->total_out += out_pos;

	strm->internal->avail_in = strm->avail_in;

	// Cast is needed to silence a warning about LZMA_TIMED_OUT, which
	// isn't part of lzma_ret enumeration.
	switch ((unsigned int)(ret)) {
	case LZMA_OK:
		// Don't return LZMA_BUF_ERROR when it happens the first time.
		// This is to avoid returning LZMA_BUF_ERROR when avail_out
		// was zero but still there was no more data left to written
		// to next_out.
		if (out_pos == 0 && in_pos == 0) {
			if (strm->internal->allow_buf_error)
				ret = LZMA_BUF_ERROR;
			else
				strm->internal->allow_buf_error = true;
		} else {
			strm->internal->allow_buf_error = false;
		}
		break;

	case LZMA_TIMED_OUT:
		strm->internal->allow_buf_error = false;
		ret = LZMA_OK;
		break;

	case LZMA_STREAM_END:
		if (strm->internal->sequence == ISEQ_SYNC_FLUSH
				|| strm->internal->sequence == ISEQ_FULL_FLUSH
				|| strm->internal->sequence
					== ISEQ_FULL_BARRIER)
			strm->internal->sequence = ISEQ_RUN;
		else
			strm->internal->sequence = ISEQ_END;

	// Fall through

	case LZMA_NO_CHECK:
	case LZMA_UNSUPPORTED_CHECK:
	case LZMA_GET_CHECK:
	case LZMA_MEMLIMIT_ERROR:
		// Something else than LZMA_OK, but not a fatal error,
		// that is, coding may be continued (except if ISEQ_END).
		strm->internal->allow_buf_error = false;
		break;

	default:
		// All the other errors are fatal; coding cannot be continued.
		assert(ret != LZMA_BUF_ERROR);
		strm->internal->sequence = ISEQ_ERROR;
		break;
	}

	return ret;
}